

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_id.cc
# Opt level: O0

S2CellId __thiscall S2CellId::advance(S2CellId *this,int64 steps)

{
  int iVar1;
  uint64 uVar2;
  ulong uVar3;
  byte bVar4;
  int64 max_steps;
  int64 min_steps;
  ulong uStack_20;
  int step_shift;
  int64 steps_local;
  S2CellId *this_local;
  
  if (steps == 0) {
    this_local = (S2CellId *)this->id_;
  }
  else {
    iVar1 = level(this);
    bVar4 = ('\x1e' - (char)iVar1) * '\x02' + 1;
    if (steps < 0) {
      uVar3 = -(this->id_ >> (bVar4 & 0x3f));
      uStack_20 = steps;
      if (steps < (long)uVar3) {
        uStack_20 = uVar3;
      }
    }
    else {
      uVar2 = lsb(this);
      uVar3 = (uVar2 + 0xc000000000000000) - this->id_ >> (bVar4 & 0x3f);
      uStack_20 = steps;
      if ((long)uVar3 < steps) {
        uStack_20 = uVar3;
      }
    }
    S2CellId((S2CellId *)&this_local,this->id_ + (uStack_20 << (bVar4 & 0x3f)));
  }
  return (S2CellId)(uint64)this_local;
}

Assistant:

S2CellId S2CellId::advance(int64 steps) const {
  if (steps == 0) return *this;

  // We clamp the number of steps if necessary to ensure that we do not
  // advance past the End() or before the Begin() of this level.  Note that
  // min_steps and max_steps always fit in a signed 64-bit integer.

  int step_shift = 2 * (kMaxLevel - level()) + 1;
  if (steps < 0) {
    int64 min_steps = -static_cast<int64>(id_ >> step_shift);
    if (steps < min_steps) steps = min_steps;
  } else {
    int64 max_steps = (kWrapOffset + lsb() - id_) >> step_shift;
    if (steps > max_steps) steps = max_steps;
  }
  // If steps is negative, then shifting it left has undefined behavior.
  // Cast to uint64 for a 2's complement answer.
  return S2CellId(id_ + (static_cast<uint64>(steps) << step_shift));
}